

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O1

int __thiscall Player::reinforce(Player *this)

{
  pointer *ppCVar1;
  string *psVar2;
  pointer pcVar3;
  vector<CardType,_std::allocator<CardType>_> *pvVar4;
  pointer pCVar5;
  Hand *hand;
  Deck *deck;
  vector<Map::Continent_*,_std::allocator<Map::Continent_*>_> *pvVar6;
  pointer ppCVar7;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar8;
  pointer ppCVar9;
  Country *pCVar10;
  bool bVar11;
  int iVar12;
  uint uVar13;
  PlayerState *pPVar14;
  ostream *poVar15;
  size_t sVar16;
  GameLoop *pGVar17;
  pointer ppCVar18;
  long *plVar19;
  uint uVar20;
  char *pcVar21;
  ulong uVar22;
  pointer ppCVar23;
  int iVar24;
  const_iterator __begin1;
  pointer pCVar25;
  pointer ppCVar26;
  CardType CVar27;
  int iVar28;
  int iVar29;
  bool bVar30;
  int local_ac;
  int local_9c;
  vector<CardType,_std::allocator<CardType>_> local_98;
  pointer local_78;
  int local_70 [4];
  pointer local_60;
  CardType local_54;
  pointer local_50;
  vector<CardType,_std::allocator<CardType>_> local_48;
  
  if (this->currentState != (PlayerState *)0x0) {
    operator_delete(this->currentState,4);
  }
  pPVar14 = (PlayerState *)operator_new(4);
  *pPVar14 = REINFORCING;
  this->currentState = pPVar14;
  notifyAll(this);
  psVar2 = this->strategy->strategyName;
  ppCVar1 = &local_98.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  pcVar3 = (psVar2->_M_dataplus)._M_p;
  local_98.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)ppCVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,pcVar3,pcVar3 + psVar2->_M_string_length);
  iVar12 = std::__cxx11::string::compare((char *)&local_98);
  if ((pointer *)
      local_98.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl.
      super__Vector_impl_data._M_start != ppCVar1) {
    operator_delete(local_98.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)local_98.super__Vector_base<CardType,_std::allocator<CardType>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
  }
  if (iVar12 == 0) {
    iVar12 = (**this->strategy->_vptr_PlayerStrategy)(this->strategy,10);
    iVar12 = (int)(char)iVar12;
  }
  else {
    local_9c = 0;
    do {
      pvVar4 = this->pCards->handPointer;
      pCVar25 = (pvVar4->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pCVar5 = (pvVar4->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if ((ulong)((long)pCVar5 - (long)pCVar25) < 0x15) {
        if (pCVar25 == pCVar5) {
          iVar12 = 0;
          iVar29 = 0;
          iVar28 = 0;
        }
        else {
          iVar28 = 0;
          iVar29 = 0;
          iVar12 = 0;
          do {
            CVar27 = *pCVar25;
            if (CVar27 == CAVALRY) {
              iVar12 = iVar12 + 1;
            }
            else if (CVar27 == ARTILLERY) {
              iVar29 = iVar29 + 1;
            }
            else if (CVar27 == INFANTRY) {
              iVar28 = iVar28 + 1;
            }
            pCVar25 = pCVar25 + 1;
          } while (pCVar25 != pCVar5);
        }
        if (((iVar28 < 3 && iVar29 < 3) && iVar12 < 3) &&
           (((iVar29 < 1 || (iVar28 < 1)) || (iVar12 < 1)))) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"You don\'t have valid cards to exchange! Moving on...",
                     0x34);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
          std::ostream::put(-0x80);
          std::ostream::flush();
          local_ac = local_9c;
          iVar12 = local_ac;
          break;
        }
        while( true ) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Would you like to exchange cards? (Y/n)",0x27);
          uVar13 = (**this->strategy->_vptr_PlayerStrategy)(this->strategy,10);
          uVar20 = (uVar13 & 0xff) - 0x4e;
          if ((uVar20 < 0x2c) && ((0x80100000801U >> ((ulong)uVar20 & 0x3f) & 1) != 0)) break;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"\nInvalid Input. Please try again.",0x21);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
          std::ostream::put(-0x80);
          std::ostream::flush();
        }
        iVar12 = local_9c;
        if (((byte)uVar13 & 0x5f) == 0x4e) break;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "You have more than 5 cards in your hand, so you must exchange at least once",
                   0x4b);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
        std::ostream::put(-0x80);
        std::ostream::flush();
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"What cards would you like to exchange?",0x26);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
      std::ostream::put(-0x80);
      std::ostream::flush();
      pvVar4 = this->pCards->handPointer;
      pcVar21 = (char *)(pvVar4->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
                        super__Vector_impl_data._M_start;
      ppCVar23 = (pointer)(pvVar4->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
                          super__Vector_impl_data._M_finish;
      local_70[1] = 0;
      iVar28 = 0;
      bVar30 = (pointer)pcVar21 == ppCVar23;
      iVar12 = local_70[1];
      if (bVar30) {
        iVar29 = 0;
      }
      else {
        iVar29 = 0;
        do {
          CVar27 = *(CardType *)pcVar21;
          if (CVar27 == CAVALRY) {
            iVar29 = iVar29 + 1;
LAB_0010eee1:
            bVar11 = true;
          }
          else {
            if (CVar27 == ARTILLERY) {
              iVar12 = iVar12 + 1;
              goto LAB_0010eee1;
            }
            if (CVar27 == INFANTRY) {
              iVar28 = iVar28 + 1;
              goto LAB_0010eee1;
            }
            local_ac = -1;
            bVar11 = false;
          }
          if (!bVar11) break;
          pcVar21 = (char *)((long)pcVar21 + 4);
          bVar30 = (pointer)pcVar21 == ppCVar23;
        } while (!bVar30);
      }
      local_70[1] = iVar12;
      local_70[0] = iVar28;
      local_70[2] = iVar29;
      if (bVar30) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"You hand is: ",0xd);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
        std::ostream::put(-0x80);
        std::ostream::flush();
        poVar15 = (ostream *)std::ostream::operator<<(&std::cout,iVar28);
        std::__ostream_insert<char,std::char_traits<char>>(poVar15," infantry, ",0xb);
        poVar15 = (ostream *)std::ostream::operator<<(&std::cout,iVar12);
        std::__ostream_insert<char,std::char_traits<char>>(poVar15," artillery, and ",0x10);
        poVar15 = (ostream *)std::ostream::operator<<(&std::cout,iVar29);
        std::__ostream_insert<char,std::char_traits<char>>(poVar15," cavalry",8);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
        std::ostream::put((char)poVar15);
        std::ostream::flush();
        local_98.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_98.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl.
        super__Vector_impl_data._M_finish = (CardType *)0x0;
        local_98.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (CardType *)0x0;
        iVar12 = 3;
        do {
          if (iVar12 < 1) {
            hand = this->pCards;
            pGVar17 = GameLoop::getInstance();
            deck = pGVar17->gameDeck;
            std::vector<CardType,_std::allocator<CardType>_>::vector(&local_48,&local_98);
            iVar12 = Hand::exchange(hand,deck,&local_48);
            if (local_48.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_48.super__Vector_base<CardType,_std::allocator<CardType>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_48.super__Vector_base<CardType,_std::allocator<CardType>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_48.super__Vector_base<CardType,_std::allocator<CardType>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if (iVar12 != -1) {
              local_9c = local_9c + iVar12;
              bVar30 = true;
              goto LAB_0010f350;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"An error occurred while exchanging your cards.",0x2e);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
            std::ostream::put(-0x80);
            std::ostream::flush();
            local_ac = -1;
            break;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"You must pick ",0xe);
          poVar15 = (ostream *)std::ostream::operator<<(&std::cout,iVar12);
          std::__ostream_insert<char,std::char_traits<char>>(poVar15," more cards to exchange",0x17)
          ;
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
          std::ostream::put((char)poVar15);
          std::ostream::flush();
          uVar22 = 0;
          local_50 = (pointer)0x0;
          do {
            local_78 = (pointer)CONCAT44(local_78._4_4_,local_70[uVar22]);
            if (0 < local_70[uVar22]) {
              pcVar21 = "cavalry";
              if (uVar22 == 1) {
                pcVar21 = "artillery";
              }
              if (uVar22 == 0) {
                pcVar21 = "infantry";
              }
              uVar13 = 0;
              bVar30 = true;
              local_60 = (pointer)pcVar21;
              do {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"How many ",9);
                ppCVar23 = local_60;
                sVar16 = strlen((char *)local_60);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,(char *)ppCVar23,sVar16);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout," would you like to exchange?",0x1c);
                CVar27 = (CardType)uVar22;
                (*this->strategy->_vptr_PlayerStrategy[3])(this->strategy,uVar22 & 0xffffffff);
                iVar28 = (*this->strategy->_vptr_PlayerStrategy[1])(this->strategy,0xb);
                iVar29 = iVar12 - iVar28;
                if (iVar12 < iVar28) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"You can only exchange ",0x16);
                  poVar15 = (ostream *)std::ostream::operator<<(&std::cout,iVar12);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar15," more cards",0xb);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
                  std::ostream::put((char)poVar15);
                  std::ostream::flush();
                }
                else if ((int)local_78 < iVar28) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,
                             "You cannot exchange more cards of a given type than you have in your hand."
                             ,0x4a);
                }
                else {
                  iVar24 = iVar28;
                  if (0 < iVar28) {
                    do {
                      local_54 = CVar27;
                      if (local_98.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl.
                          super__Vector_impl_data._M_finish ==
                          local_98.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage) {
                        std::vector<CardType,_std::allocator<CardType>_>::
                        _M_realloc_insert<CardType>
                                  (&local_98,
                                   (iterator)
                                   local_98.super__Vector_base<CardType,_std::allocator<CardType>_>.
                                   _M_impl.super__Vector_impl_data._M_finish,&local_54);
                      }
                      else {
                        *local_98.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl.
                         super__Vector_impl_data._M_finish = CVar27;
                        local_98.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl.
                        super__Vector_impl_data._M_finish =
                             local_98.super__Vector_base<CardType,_std::allocator<CardType>_>.
                             _M_impl.super__Vector_impl_data._M_finish + 1;
                      }
                      iVar24 = iVar24 + -1;
                      iVar12 = iVar29;
                    } while (iVar24 != 0);
                  }
                }
                if (((iVar28 <= (int)local_78) && (iVar28 <= iVar12)) || (iVar12 == 0))
                goto LAB_0010f26f;
                bVar30 = uVar13 < 9;
                uVar13 = uVar13 + 1;
              } while (uVar13 != 10);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"An error occurred while exchanging your cards.",0x2e
                        );
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
              std::ostream::put(-0x80);
              local_ac = -1;
              std::ostream::flush();
LAB_0010f26f:
              if (!bVar30) break;
            }
            bVar30 = 1 < uVar22;
            uVar22 = uVar22 + 1;
            pcVar21 = (char *)CONCAT71((int7)((ulong)pcVar21 >> 8),bVar30);
            local_50 = (pointer)pcVar21;
          } while (uVar22 != 3);
        } while (((ulong)local_50 & 1) != 0);
        bVar30 = false;
LAB_0010f350:
        if ((pointer *)
            local_98.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer *)0x0) {
          operator_delete(local_98.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_98.super__Vector_base<CardType,_std::allocator<CardType>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_98.super__Vector_base<CardType,_std::allocator<CardType>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
      }
      else {
        bVar30 = false;
      }
      iVar12 = local_ac;
    } while (bVar30);
    local_ac = iVar12;
    if (local_ac < 0) {
      if (this->currentState != (PlayerState *)0x0) {
        operator_delete(this->currentState,4);
      }
      pPVar14 = (PlayerState *)operator_new(4);
      *pPVar14 = IDLE;
      this->currentState = pPVar14;
      (*this->strategy->_vptr_PlayerStrategy[5])();
      iVar12 = -1;
    }
    else {
      uVar22 = (long)(this->pOwnedCountries->
                     super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->pOwnedCountries->
                     super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 3;
      iVar12 = 3;
      if (8 < uVar22) {
        iVar12 = (int)uVar22 / 3;
      }
      iVar12 = iVar12 + local_ac;
      pGVar17 = GameLoop::getInstance();
      pvVar6 = pGVar17->gameMap->pMapContinents;
      ppCVar18 = (pvVar6->super__Vector_base<Map::Continent_*,_std::allocator<Map::Continent_*>_>).
                 _M_impl.super__Vector_impl_data._M_start;
      ppCVar7 = (pvVar6->super__Vector_base<Map::Continent_*,_std::allocator<Map::Continent_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
      if (ppCVar18 == ppCVar7) {
        iVar28 = 0;
      }
      else {
        iVar28 = 0;
        do {
          pvVar8 = (*ppCVar18)->pCountriesInContinent;
          ppCVar23 = (pvVar8->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                     _M_impl.super__Vector_impl_data._M_start;
          ppCVar9 = (pvVar8->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
          if (ppCVar23 == ppCVar9) {
LAB_0010f47a:
            iVar28 = iVar28 + *(*ppCVar18)->pCTroops;
          }
          else {
            bVar30 = true;
            do {
              ppCVar26 = ppCVar23 + 1;
              if (*this->pPlayerId != *(*ppCVar23)->pPlayerOwnerId) {
                bVar30 = false;
                break;
              }
              ppCVar23 = ppCVar26;
            } while (ppCVar26 != ppCVar9);
            if (bVar30) goto LAB_0010f47a;
          }
          ppCVar18 = ppCVar18 + 1;
        } while (ppCVar18 != ppCVar7);
      }
      (*this->strategy->_vptr_PlayerStrategy[2])(this->strategy,(ulong)(uint)(iVar12 + iVar28));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Place your armies:",0x12);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
      std::ostream::put(-0x80);
      std::ostream::flush();
      uVar13 = iVar12 + iVar28;
      if (uVar13 != 0 && SCARRY4(iVar12,iVar28) == (int)uVar13 < 0) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Troops remaining: ",0x12);
          plVar19 = (long *)std::ostream::operator<<(&std::cout,uVar13);
          std::ios::widen((char)*(undefined8 *)(*plVar19 + -0x18) + (char)plVar19);
          std::ostream::put((char)plVar19);
          std::ostream::flush();
          ppCVar23 = (this->pOwnedCountries->
                     super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                     super__Vector_impl_data._M_start;
          local_60 = (this->pOwnedCountries->
                     super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
          uVar20 = uVar13;
          if (ppCVar23 != local_60) {
            do {
              pCVar10 = *ppCVar23;
              local_98.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)&local_98.super__Vector_base<CardType,_std::allocator<CardType>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage;
              pcVar3 = (pCVar10->cyName->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_98,pcVar3,pcVar3 + pCVar10->cyName->_M_string_length);
              poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,
                                   (char *)local_98.
                                           super__Vector_base<CardType,_std::allocator<CardType>_>.
                                           _M_impl.super__Vector_impl_data._M_start,
                                   (long)local_98.
                                         super__Vector_base<CardType,_std::allocator<CardType>_>.
                                         _M_impl.super__Vector_impl_data._M_finish);
              std::__ostream_insert<char,std::char_traits<char>>(poVar15," has ",5);
              poVar15 = (ostream *)std::ostream::operator<<(poVar15,*pCVar10->pNumberOfTroops);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar15," armies. Add how many? ",0x17);
              if ((pointer *)
                  local_98.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl.
                  super__Vector_impl_data._M_start !=
                  &local_98.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage) {
                operator_delete(local_98.super__Vector_base<CardType,_std::allocator<CardType>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (ulong)((long)local_98.
                                              super__Vector_base<CardType,_std::allocator<CardType>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 1
                                       ));
              }
              do {
                local_78 = ppCVar23;
                (*this->strategy->_vptr_PlayerStrategy[4])(this->strategy,pCVar10);
                (*this->strategy->_vptr_PlayerStrategy[2])(this->strategy,(ulong)uVar20);
                iVar12 = (*this->strategy->_vptr_PlayerStrategy[1])(this->strategy,0xc);
                if ((((byte)secure_getenv[*(long *)(std::cin + -0x18)] & 5) != 0) ||
                   ((int)uVar20 < iVar12 || iVar12 < 0)) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"Invalid value entered. Pleased try again.",0x29)
                  ;
                  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
                  std::ostream::put(-0x80);
                  std::ostream::flush();
                }
                ppCVar23 = local_78;
              } while ((((byte)secure_getenv[*(long *)(std::cin + -0x18)] & 5) != 0) ||
                      (iVar12 < 0 || (int)uVar20 < iVar12));
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
              std::ostream::put(-0x80);
              std::ostream::flush();
              *pCVar10->pNumberOfTroops = *pCVar10->pNumberOfTroops + iVar12;
              uVar13 = uVar20 - iVar12;
              if (uVar13 == 0 || (int)uVar20 < iVar12) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"\nYou\'ve placed all your armies!",0x1f);
                std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
                std::ostream::put(-0x80);
                std::ostream::flush();
                break;
              }
              ppCVar23 = local_78 + 1;
              uVar20 = uVar13;
            } while (ppCVar23 != local_60);
          }
        } while (0 < (int)uVar13);
      }
      if (this->currentState != (PlayerState *)0x0) {
        operator_delete(this->currentState,4);
      }
      pPVar14 = (PlayerState *)operator_new(4);
      *pPVar14 = IDLE;
      this->currentState = pPVar14;
      (*this->strategy->_vptr_PlayerStrategy[5])();
      iVar12 = 1;
    }
  }
  return iVar12;
}

Assistant:

int Player::reinforce() {
    /* Act of collecting new armies and placing them on the map
     * 0. At the start of your turn, if you have 5+ cards, player must trade at least 1 set.
     * 1. Trade valid sets of cards to receive armies
     * 2. Place received armies on the map
     */
    auto cardExchange = [](Player &player) {
        auto output = 0;

        while (true) {
            if (player.getCards()->getHand()->size() > 5) {
                std::cout << "You have more than 5 cards in your hand, so you must exchange at least once" << std::endl;
            } else if (canExchange(*player.getCards()->getHand())) {
                char input = 0;
                do {
                    std::cout << "Would you like to exchange cards? (Y/n)";
                    input = player.strategy->yesOrNo(StrategyContext::REINFORCE);
                    if (input != 'y' && input != 'n' && input != 'Y' && input != 'N') {
                        std::cout << "\nInvalid Input. Please try again." << std::endl;
                    }
                } while (input != 'y' && input != 'n' && input != 'Y' && input != 'N');
                if (input == 'n' || input == 'N') {
                    return output;
                }
            } else {
                std::cout << "You don't have valid cards to exchange! Moving on..." << std::endl;
                return output;
            }
            std::cout << "What cards would you like to exchange?" << std::endl;
            int types[3] = {};
            types[0] = 0, types[1] = 0, types[2] = 0;
            for (auto card : *player.getCards()->getHand()) {
                switch (card) {
                    case CardType::INFANTRY:
                        types[0]++;
                        break;
                    case CardType::ARTILLERY:
                        types[1]++;
                        break;
                    case CardType::CAVALRY:
                        types[2]++;
                        break;
                    default: {
                        return -1;
                    }
                }
            }

            std::cout << "You hand is: " << std::endl;
            std::cout << types[0] << " infantry, ";
            std::cout << types[1] << " artillery, and ";
            std::cout << types[2] << " cavalry" << std::endl;

            auto cardsToExchange = std::vector<CardType>();
            auto remaining = 3;

            while (remaining > 0) {
                std::cout << "You must pick " << remaining << " more cards to exchange" << std::endl;
                for (auto i = 0; i <= 2; i++) {
                    if (types[i] > 0) {
                        auto input = 0;
                        int failsafeCounter = 0;
                        do {
                            //avoid infinite loops in case of bot malfunction or human delaying the game
                            if(failsafeCounter >= 10){
                                std::cout << "An error occurred while exchanging your cards." << std::endl;
                                return -1;
                            }
                            failsafeCounter++;
                            std::cout << "How many " << (i == 0 ? "infantry" : i == 1 ? "artillery" : "cavalry");
                            std::cout << " would you like to exchange?";
                            player.strategy->setExchangingCardType(i);
                            input = player.strategy->intInput(StrategyContext::REINFORCE_CARD_COUNT);
                            if (input > remaining) {
                                std::cout << "You can only exchange " << remaining << " more cards" << std::endl;
                            } else if (input > types[i]) {
                                std::cout
                                        << "You cannot exchange more cards of a given type than you have in your hand.";
                            } else {
                                for (auto j = 0; j < input; j++, remaining--) {
                                    cardsToExchange.push_back((CardType) i);
                                }

                            }
                        } while ((input > types[i] || input > remaining) && remaining != 0);
                    }
                }
            }
            auto out = Hand::exchange(player.getCards(), GameLoop::getInstance()->getGameDeck(), cardsToExchange);
            if (out == -1) {
                std::cout << "An error occurred while exchanging your cards." << std::endl;
                return -1;
            } else {
                output += out;
            }
        }
    };

    auto countriesOwned = [](Player& player) {
        auto countries = player.getOwnedCountries()->size();

        return countries < 9 ? 3 : (int) countries / 3;
    };

    auto continentControlValue = [](const Player &player) {
        auto value = 0;
        for (auto *cont : *GameLoop::getInstance()->getGameMap()->getMapContinents()) {
            auto fullControl = true;

            for (auto *country : *cont->getCountriesInContinent()) {
                if (player.getPlayerId() != country->getPlayerOwnerID()) {
                    fullControl = false;
                    break;
                }
            }

            if (fullControl) {
                value += cont->getpCTroops();
            }
        }

        return value;
    };

    this->setPlayerState(PlayerState::REINFORCING);
    this->notifyAll();

    if ( this->getStrategy()->getStrategyName() == "CHEATER") {
        return (PlayerAction) this->getStrategy()->yesOrNo(StrategyContext::REINFORCE);
    }

    auto exchange = cardExchange(*this);
    if (exchange < 0) {
        this->setPlayerState(PlayerState::IDLE);
        this->strategy->resetChoices();
        return PlayerAction::FAILED;
    }

    auto newArmies = exchange + countriesOwned(*this) + continentControlValue(*this);
    strategy->setArmiesToPlace(newArmies);

    std::cout << "Place your armies:" << std::endl;

    int troops, place = 0;
    while (newArmies > 0) {
        std::cout << "Troops remaining: " << newArmies << std::endl;
        for (auto *country : *this->getOwnedCountries()) {
            std::cout << country->getCountryName() << " has " << country->getNumberOfTroops() << " armies. Add how many? ";
            do {
                strategy->setTo(country);
                strategy->setArmiesToPlace(newArmies);
                place = strategy->intInput(StrategyContext::REINFORCE_ARMY_COUNT);
                if(cin.fail() || place > newArmies || place < 0 || isnan(place)) {
                    std::cout << "Invalid value entered. Pleased try again." << std::endl;
                }
            } while (cin.fail() || place > newArmies || place < 0 || isnan(place));
            std::cout << std::endl;
            troops = country->getNumberOfTroops();
            country->setNumberOfTroops(troops + place);
            newArmies -= place;
            if (newArmies <= 0) {
                std::cout << "\nYou've placed all your armies!" << std::endl;
                break;
            }
        }
    }
    this->setPlayerState(PlayerState::IDLE);
    this->strategy->resetChoices();
    return PlayerAction::SUCCEEDED;
}